

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

Top __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node::top(Node *this)

{
  Top TVar1;
  TermList *unaff_retaddr;
  
  TVar1 = Kernel::TermList::top(unaff_retaddr);
  return (Inner)(Inner)TVar1;
}

Assistant:

inline TermList::Top top() { 
#if CACHE_FUNCTOR
      auto out = _term.isTerm() ? TermList::Top::functor(_functor) : _term.top(); 
      ASS_EQ(_term.top(), out); 
      return out; 
#else // !CACHE_FUNCTOR
      return _term.top(); 
#endif
    }